

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O3

int SSL_serialize_capabilities(SSL *ssl,CBB *out)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  CBB seq;
  CBB local_40;
  
  iVar2 = CBB_add_asn1(out,&local_40,0x20000010);
  uVar3 = 0;
  if (iVar2 != 0) {
    bVar1 = bssl::serialize_features(&local_40);
    if (bVar1) {
      iVar2 = CBB_flush(out);
      uVar3 = (uint)(iVar2 != 0);
    }
  }
  return uVar3;
}

Assistant:

int SSL_serialize_capabilities(const SSL *ssl, CBB *out) {
  CBB seq;
  if (!CBB_add_asn1(out, &seq, CBS_ASN1_SEQUENCE) ||
      !serialize_features(&seq) ||  //
      !CBB_flush(out)) {
    return 0;
  }

  return 1;
}